

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

void __thiscall libchars::command_node::~command_node(command_node *this)

{
  command_node *pcVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  pcVar1 = this->head;
  if (pcVar1 != (command_node *)0x0) {
    ~command_node(pcVar1);
  }
  operator_delete(pcVar1,0x58);
  pcVar1 = this->start;
  if (pcVar1 != (command_node *)0x0) {
    ~command_node(pcVar1);
  }
  operator_delete(pcVar1,0x58);
  pcVar1 = this->next;
  if (pcVar1 != (command_node *)0x0) {
    ~command_node(pcVar1);
  }
  operator_delete(pcVar1,0x58);
  pcVar2 = (this->part)._M_dataplus._M_p;
  paVar3 = &(this->part).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

command_node::~command_node()
    {
        delete head;
        delete start;
        delete next;
    }